

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O3

void __thiscall Itemset::print_idlist(Itemset *this,ostream *idlstrm)

{
  element_type *peVar1;
  ostream *poVar2;
  element_type *peVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  
  peVar1 = (this->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 == (element_type *)0x0) || (peVar1->theSize < 1)) {
    return;
  }
  peVar3 = (peVar1->theArray).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  piVar8 = *(int **)&(peVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
  if (*(pointer *)((long)&(peVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8) ==
      piVar8) {
    uVar7 = 0;
    uVar4 = 0;
  }
  else {
    iVar6 = *piVar8;
    iVar5 = 0;
    uVar7 = 0;
    while( true ) {
      uVar4 = (long)*(pointer *)
                     ((long)&(peVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8) -
              (long)piVar8 >> 2;
      if (uVar4 <= uVar7) break;
      if (iVar6 == piVar8[uVar7]) {
        iVar5 = iVar5 + 1;
        uVar7 = (ulong)((int)uVar7 + 2);
      }
      else {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)idlstrm,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        peVar1 = (this->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar3 = (peVar1->theArray).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        piVar8 = *(int **)&(peVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
        uVar4 = (long)*(pointer *)
                       ((long)&(peVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8)
                - (long)piVar8 >> 2;
        if (uVar4 <= uVar7) break;
        iVar6 = piVar8[uVar7];
        iVar5 = 0;
      }
      if (peVar1->theSize <= (int)uVar7) {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)idlstrm,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        std::ostream::operator<<((ostream *)poVar2,iVar5);
        return;
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7,uVar4
            );
}

Assistant:

void Itemset::print_idlist(ostream& idlstrm) {
    int i, cid, cnt;

    if (theIval && theIval->size() > 0) {
        cid = (*theIval)[0];
        cnt = 0;
        for (i = 0; i <theIval->size();) {
            if (cid == (*theIval)[i]) {
                cnt++;
                i += 2;
            } else {
                idlstrm << cid << " " << cnt << " ";
                cid = (*theIval)[i];
                cnt = 0;
            }
        }
        idlstrm << cid << " " << cnt;
    }
}